

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

void secp256k1_scalar_inverse_var(secp256k1_scalar *r,secp256k1_scalar *x)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined4 extraout_EAX;
  int iVar5;
  uint uVar6;
  secp256k1_gej *psVar7;
  int64_t iVar8;
  int64_t iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t *puVar13;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  long lVar14;
  byte bVar15;
  undefined4 uVar16;
  int iVar17;
  uint uVar18;
  secp256k1_modinv64_signed62 *psVar19;
  secp256k1_modinv64_signed62 *psVar20;
  ulong *extraout_RDX;
  long lVar21;
  long lVar22;
  secp256k1_gej *psVar23;
  secp256k1_gej *psVar24;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  secp256k1_modinv64_signed62 *a;
  long *extraout_RDX_09;
  long lVar25;
  secp256k1_modinv64_signed62 *b;
  secp256k1_gej *psVar26;
  secp256k1_gej *psVar27;
  secp256k1_gej *psVar28;
  long lVar29;
  secp256k1_fe *a_00;
  secp256k1_gej *a_01;
  secp256k1_gej *psVar30;
  secp256k1_gej *psVar31;
  secp256k1_gej *psVar32;
  secp256k1_gej *psVar33;
  secp256k1_gej *psVar34;
  secp256k1_gej *psVar35;
  secp256k1_gej *psVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  secp256k1_modinv64_signed62 *psVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  secp256k1_modinv64_signed62 s;
  secp256k1_modinv64_signed62 sStack_320;
  secp256k1_modinv64_signed62 sStack_2f8;
  secp256k1_gej *psStack_2d0;
  secp256k1_gej *psStack_2c8;
  secp256k1_modinv64_signed62 *psStack_2c0;
  ulong uStack_2b8;
  secp256k1_gej *psStack_2b0;
  ulong uStack_2a8;
  secp256k1_gej *psStack_2a0;
  secp256k1_modinv64_signed62 *psStack_298;
  secp256k1_gej *psStack_290;
  uint64_t uStack_288;
  uint64_t uStack_280;
  secp256k1_gej *psStack_278;
  uint64_t uStack_270;
  uint64_t uStack_268;
  uint64_t uStack_260;
  uint64_t uStack_258;
  uint64_t uStack_250;
  secp256k1_gej *psStack_248;
  secp256k1_gej *psStack_240;
  secp256k1_gej *psStack_238;
  secp256k1_gej *psStack_230;
  secp256k1_gej *psStack_228;
  long lStack_220;
  secp256k1_gej *psStack_218;
  code *pcStack_210;
  uint uStack_204;
  ulong uStack_200;
  secp256k1_gej *apsStack_1f8 [2];
  undefined1 auStack_1e8 [56];
  uint64_t auStack_1b0 [5];
  secp256k1_modinv64_trans2x2 sStack_188;
  undefined1 auStack_168 [96];
  secp256k1_gej *psStack_108;
  ulong uStack_100;
  secp256k1_gej *psStack_f8;
  ulong uStack_f0;
  secp256k1_gej *psStack_e8;
  secp256k1_gej *psStack_d8;
  secp256k1_gej *psStack_d0;
  secp256k1_gej *psStack_c0;
  secp256k1_fe *psStack_b8;
  secp256k1_fe sStack_b0;
  secp256k1_scalar *psStack_80;
  secp256k1_gej *psStack_78;
  code *pcStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  secp256k1_gej *local_50;
  ulong local_48;
  ulong local_40;
  secp256k1_gej *local_38;
  
  pcStack_70 = (code *)0x148e98;
  secp256k1_scalar_verify(x);
  local_68 = x->d[2] | x->d[0];
  uStack_60 = x->d[3] | x->d[1];
  pcStack_70 = (code *)0x148eb0;
  secp256k1_scalar_verify(x);
  uVar37 = x->d[0];
  uVar10 = x->d[1];
  uVar11 = x->d[2];
  uVar12 = x->d[3];
  pcStack_70 = (code *)0x148ec7;
  secp256k1_scalar_verify(x);
  uVar16 = 0xffffffff;
  uVar40 = uVar37 & 0x3fffffffffffffff;
  psVar36 = (secp256k1_gej *)((uVar10 & 0xfffffffffffffff) << 2 | uVar37 >> 0x3e);
  uVar37 = (uVar11 & 0x3ffffffffffffff) << 4 | uVar10 >> 0x3c;
  local_40 = (uVar12 & 0xffffffffffffff) << 6 | uVar11 >> 0x3a;
  psVar27 = (secp256k1_gej *)(uVar12 >> 0x38);
  pcStack_70 = (code *)0x148f1a;
  local_58 = uVar40;
  local_50 = psVar36;
  local_48 = uVar37;
  local_38 = psVar27;
  secp256k1_modinv64_var
            ((secp256k1_modinv64_signed62 *)&stack0xffffffffffffffa8,&secp256k1_const_modinfo_scalar
            );
  pcStack_70 = (code *)0x148f25;
  psVar26 = (secp256k1_gej *)&stack0xffffffffffffffa8;
  secp256k1_scalar_from_signed62(r,(secp256k1_modinv64_signed62 *)&stack0xffffffffffffffa8);
  pcStack_70 = (code *)0x148f2d;
  secp256k1_scalar_verify(r);
  pcStack_70 = (code *)0x148f35;
  a_00 = (secp256k1_fe *)r;
  secp256k1_scalar_verify(r);
  auVar44._0_4_ = -(uint)((int)r->d[2] == 0 && (int)r->d[0] == 0);
  auVar44._4_4_ = -(uint)(*(int *)((long)r->d + 0x14) == 0 && *(int *)((long)r->d + 4) == 0);
  auVar44._8_4_ = -(uint)((int)r->d[3] == 0 && (int)r->d[1] == 0);
  auVar44._12_4_ = -(uint)(*(int *)((long)r->d + 0x1c) == 0 && *(int *)((long)r->d + 0xc) == 0);
  iVar5 = movmskps(extraout_EAX,auVar44);
  auVar45._0_4_ = -(uint)((int)local_68 == 0);
  auVar45._4_4_ = -(uint)(local_68._4_4_ == 0);
  auVar45._8_4_ = -(uint)((int)uStack_60 == 0);
  auVar45._12_4_ = -(uint)(uStack_60._4_4_ == 0);
  iVar17 = movmskps(uVar16,auVar45);
  if ((iVar17 != 0xf) != (iVar5 == 0xf)) {
    return;
  }
  pcStack_70 = secp256k1_gej_eq_x_var;
  secp256k1_scalar_inverse_var_cold_1();
  psStack_b8 = (secp256k1_fe *)0x148f91;
  psVar32 = psVar26;
  psStack_80 = r;
  psStack_78 = (secp256k1_gej *)&stack0xffffffffffffffa8;
  pcStack_70 = (code *)uVar40;
  secp256k1_fe_verify(a_00);
  psStack_b8 = (secp256k1_fe *)0x148f99;
  psVar23 = psVar26;
  secp256k1_gej_verify(psVar26);
  if (psVar26->infinity == 0) {
    psStack_b8 = (secp256k1_fe *)0x148fb1;
    secp256k1_fe_sqr(&sStack_b0,&psVar26->z);
    psStack_b8 = (secp256k1_fe *)0x148fbf;
    secp256k1_fe_mul(&sStack_b0,&sStack_b0,a_00);
    psStack_b8 = (secp256k1_fe *)0x148fca;
    secp256k1_fe_equal(&sStack_b0,&psVar26->x);
    return;
  }
  psStack_b8 = (secp256k1_fe *)secp256k1_fe_cmp_var;
  secp256k1_gej_eq_x_var_cold_1();
  psStack_d0 = (secp256k1_gej *)0x148fe8;
  psVar28 = psVar32;
  psStack_c0 = psVar26;
  psStack_b8 = a_00;
  secp256k1_fe_verify(&psVar23->x);
  psStack_d0 = (secp256k1_gej *)0x148ff0;
  psVar26 = psVar32;
  secp256k1_fe_verify(&psVar32->x);
  if ((psVar23->x).normalized == 0) {
    psStack_d0 = (secp256k1_gej *)0x149032;
    secp256k1_fe_cmp_var_cold_2();
  }
  else if ((psVar32->x).normalized != 0) {
    uVar6 = 4;
    while( true ) {
      uVar37 = (psVar32->x).n[uVar6];
      uVar10 = (psVar23->x).n[uVar6];
      if (uVar10 >= uVar37 && uVar10 != uVar37) {
        return;
      }
      if (uVar10 < uVar37) break;
      bVar43 = uVar6 == 0;
      uVar6 = uVar6 - 1;
      if (bVar43) {
        return;
      }
    }
    return;
  }
  psStack_d0 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_cmp_var_cold_1();
  psStack_e8 = (secp256k1_gej *)0x149046;
  psVar33 = psVar28;
  psStack_d8 = psVar32;
  psStack_d0 = psVar23;
  secp256k1_fe_verify(&psVar26->x);
  psStack_e8 = (secp256k1_gej *)0x14904e;
  psVar32 = psVar28;
  secp256k1_fe_verify(&psVar28->x);
  iVar5 = (psVar28->x).magnitude + (psVar26->x).magnitude;
  if (iVar5 < 0x21) {
    (psVar26->x).n[0] = (psVar26->x).n[0] + (psVar28->x).n[0];
    puVar13 = (psVar26->x).n + 1;
    *puVar13 = *puVar13 + (psVar28->x).n[1];
    puVar13 = (psVar26->x).n + 2;
    *puVar13 = *puVar13 + (psVar28->x).n[2];
    puVar13 = (psVar26->x).n + 3;
    *puVar13 = *puVar13 + (psVar28->x).n[3];
    puVar13 = (psVar26->x).n + 4;
    *puVar13 = *puVar13 + (psVar28->x).n[4];
    (psVar26->x).magnitude = iVar5;
    (psVar26->x).normalized = 0;
    secp256k1_fe_verify(&psVar26->x);
    return;
  }
  psStack_e8 = (secp256k1_gej *)secp256k1_modinv64_var;
  secp256k1_fe_add_cold_1();
  psStack_e8 = psVar27;
  uStack_f0 = uVar40;
  psStack_f8 = psVar28;
  uStack_100 = uVar37;
  psStack_108 = psVar36;
  auStack_168._88_8_ = psVar26;
  auStack_168._16_8_ = 0;
  auStack_168._24_8_ = 0;
  auStack_168._0_8_ = 0;
  auStack_168._8_8_ = 0;
  auStack_168._32_8_ = 0;
  auStack_168._72_8_ = 0;
  auStack_168._80_8_ = 0;
  auStack_168._56_8_ = 0;
  auStack_168._64_8_ = 0;
  auStack_168._48_8_ = 1;
  auStack_1e8._32_8_ = (psVar33->x).n[4];
  apsStack_1f8[1] = psVar33;
  auStack_1e8._16_8_ = (psVar33->x).n[2];
  auStack_1e8._24_8_ = (psVar33->x).n[3];
  auStack_1e8._0_8_ = (secp256k1_gej *)(psVar33->x).n[0];
  auStack_1e8._8_8_ = (psVar33->x).n[1];
  auStack_1b0[3] = (psVar32->x).n[4];
  auStack_1e8._48_8_ = (psVar32->x).n[0];
  auStack_1b0[0] = (psVar32->x).n[1];
  apsStack_1f8[0] = psVar32;
  auStack_1b0[1] = (psVar32->x).n[2];
  auStack_1b0[2] = (psVar32->x).n[3];
  uStack_200 = 0;
  lVar41 = -1;
  uStack_204 = 5;
LAB_00149138:
  psVar32 = (secp256k1_gej *)auStack_1e8._0_8_;
  psVar33 = apsStack_1f8[1];
  psVar7 = (secp256k1_gej *)0x0;
  psVar24 = (secp256k1_gej *)0x0;
  psVar31 = (secp256k1_gej *)0x1;
  uVar6 = 0x3e;
  psVar28 = (secp256k1_gej *)0x1;
  uVar37 = auStack_1e8._48_8_;
  psVar23 = (secp256k1_gej *)auStack_1e8._0_8_;
  while( true ) {
    a_01 = (secp256k1_gej *)(-1L << ((byte)uVar6 & 0x3f) | uVar37);
    psVar19 = (secp256k1_modinv64_signed62 *)0x0;
    if (a_01 != (secp256k1_gej *)0x0) {
      for (; ((ulong)a_01 >> (long)psVar19 & 1) == 0;
          psVar19 = (secp256k1_modinv64_signed62 *)((long)psVar19->v + 1)) {
      }
    }
    bVar15 = (byte)psVar19;
    psVar34 = (secp256k1_gej *)(uVar37 >> (bVar15 & 0x3f));
    psVar28 = (secp256k1_gej *)((long)psVar28 << (bVar15 & 0x3f));
    psVar7 = (secp256k1_gej *)((long)psVar7 << (bVar15 & 0x3f));
    lVar41 = lVar41 - (long)psVar19;
    uVar6 = uVar6 - (int)psVar19;
    if (uVar6 == 0) break;
    if (((ulong)psVar23 & 1) == 0) {
      pcStack_210 = (code *)0x1495b5;
      secp256k1_modinv64_var_cold_8();
LAB_001495b5:
      pcStack_210 = (code *)0x1495ba;
      secp256k1_modinv64_var_cold_7();
LAB_001495ba:
      pcStack_210 = (code *)0x1495bf;
      secp256k1_modinv64_var_cold_1();
LAB_001495bf:
      pcStack_210 = (code *)0x1495c4;
      secp256k1_modinv64_var_cold_2();
LAB_001495c4:
      pcStack_210 = (code *)0x1495c9;
      secp256k1_modinv64_var_cold_6();
      psVar34 = psVar23;
      goto LAB_001495c9;
    }
    if (((ulong)psVar34 & 1) == 0) goto LAB_001495b5;
    a_01 = (secp256k1_gej *)((long)psVar7 * auStack_1e8._48_8_ + (long)psVar28 * auStack_1e8._0_8_);
    psVar19 = (secp256k1_modinv64_signed62 *)(ulong)(0x3e - uVar6);
    bVar15 = (byte)(0x3e - uVar6);
    psVar26 = (secp256k1_gej *)((long)psVar23 << (bVar15 & 0x3f));
    if (a_01 != psVar26) goto LAB_001495ba;
    psVar26 = (secp256k1_gej *)
              ((long)psVar31 * auStack_1e8._48_8_ + (long)psVar24 * auStack_1e8._0_8_);
    a_01 = (secp256k1_gej *)((long)psVar34 << (bVar15 & 0x3f));
    if (psVar26 != a_01) goto LAB_001495bf;
    psVar19 = (secp256k1_modinv64_signed62 *)(lVar41 - 0x2ea);
    if (psVar19 < (secp256k1_modinv64_signed62 *)0xfffffffffffffa2d) goto LAB_001495c4;
    iVar5 = (int)psVar34;
    if (lVar41 < 0) {
      lVar41 = -lVar41;
      uVar18 = (int)lVar41 + 1;
      if ((int)uVar6 <= (int)uVar18) {
        uVar18 = uVar6;
      }
      psVar19 = (secp256k1_modinv64_signed62 *)(ulong)uVar18;
      a_01 = (secp256k1_gej *)(ulong)(uVar18 - 0x3f);
      if (0xffffffc1 < uVar18 - 0x3f) {
        psVar35 = (secp256k1_gej *)-(long)psVar7;
        psVar27 = (secp256k1_gej *)-(long)psVar28;
        psVar30 = (secp256k1_gej *)-(long)psVar23;
        psVar26 = (secp256k1_gej *)
                  ((ulong)(0x3fL << (-(char)uVar18 & 0x3fU)) >> (-(char)uVar18 & 0x3fU));
        uVar18 = (iVar5 * iVar5 + 0x3e) * iVar5 * (int)psVar30 & (uint)psVar26;
        psVar7 = psVar31;
        psVar28 = psVar24;
        psVar36 = psVar35;
        goto LAB_00149294;
      }
      goto LAB_001495d3;
    }
    uVar18 = (int)lVar41 + 1;
    if ((int)uVar6 <= (int)uVar18) {
      uVar18 = uVar6;
    }
    psVar19 = (secp256k1_modinv64_signed62 *)(ulong)uVar18;
    a_01 = (secp256k1_gej *)(ulong)(uVar18 - 0x3f);
    if (uVar18 - 0x3f < 0xffffffc2) goto LAB_001495ce;
    psVar26 = (secp256k1_gej *)((ulong)(0xfL << (-(char)uVar18 & 0x3fU)) >> (-(char)uVar18 & 0x3fU))
    ;
    uVar18 = -(iVar5 * (((int)psVar23 * 2 + 2U & 8) + (int)psVar23)) & (uint)psVar26;
    psVar27 = psVar24;
    psVar35 = psVar31;
    psVar30 = psVar34;
    psVar34 = psVar23;
LAB_00149294:
    uVar10 = (ulong)uVar18;
    a_01 = (secp256k1_gej *)(uVar10 * (long)psVar34);
    uVar37 = (long)(psVar30->x).n + (long)(a_01->x).n;
    psVar24 = (secp256k1_gej *)((long)(psVar27->x).n + (long)psVar28 * uVar10);
    psVar19 = (secp256k1_modinv64_signed62 *)(uVar10 * (long)psVar7);
    psVar31 = (secp256k1_gej *)((long)psVar19->v + (long)&psVar35->x);
    psVar23 = psVar34;
    if ((uVar37 & (ulong)psVar26) != 0) {
LAB_001495c9:
      pcStack_210 = (code *)0x1495ce;
      secp256k1_modinv64_var_cold_4();
      psVar23 = psVar34;
LAB_001495ce:
      pcStack_210 = (code *)0x1495d3;
      secp256k1_modinv64_var_cold_3();
LAB_001495d3:
      pcStack_210 = (code *)0x1495d8;
      secp256k1_modinv64_var_cold_5();
      psVar33 = psVar36;
      goto LAB_001495d8;
    }
  }
  a_01 = (secp256k1_gej *)((long)psVar7 * (long)psVar24);
  psVar19 = SUB168(SEXT816((long)psVar7) * SEXT816((long)psVar24),8);
  sStack_188.u = (int64_t)psVar28;
  sStack_188.v = (int64_t)psVar7;
  sStack_188.q = (int64_t)psVar24;
  sStack_188.r = (int64_t)psVar31;
  if ((long)psVar28 * (long)psVar31 - (long)a_01 != 0x4000000000000000 ||
      SUB168(SEXT816((long)psVar28) * SEXT816((long)psVar31),8) - (long)psVar19 !=
      (ulong)((secp256k1_gej *)((long)psVar28 * (long)psVar31) < a_01)) goto LAB_0014960f;
  pcStack_210 = (code *)0x149322;
  secp256k1_modinv64_update_de_62
            ((secp256k1_modinv64_signed62 *)auStack_168,
             (secp256k1_modinv64_signed62 *)(auStack_168 + 0x30),&sStack_188,
             (secp256k1_modinv64_modinfo *)apsStack_1f8[1]);
  uVar6 = uStack_204;
  psVar32 = (secp256k1_gej *)auStack_1e8;
  psVar26 = (secp256k1_gej *)(ulong)uStack_204;
  psVar28 = (secp256k1_gej *)(ulong)uStack_204;
  psVar19 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
  pcStack_210 = (code *)0x14933f;
  a_01 = psVar32;
  iVar5 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar32,uStack_204,
                     (secp256k1_modinv64_signed62 *)psVar33,-1);
  psVar23 = (secp256k1_gej *)(auStack_1e8 + 0x30);
  if (0 < iVar5) {
    psVar19 = (secp256k1_modinv64_signed62 *)0x1;
    psVar28 = (secp256k1_gej *)(ulong)uVar6;
    pcStack_210 = (code *)0x14935e;
    a_01 = psVar32;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar32,uVar6,
                       (secp256k1_modinv64_signed62 *)psVar33,1);
    if (0 < iVar5) goto LAB_001495dd;
    psVar28 = (secp256k1_gej *)(ulong)uVar6;
    psVar19 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_210 = (code *)0x14937a;
    a_01 = psVar23;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar23,uVar6,
                       (secp256k1_modinv64_signed62 *)psVar33,-1);
    if (iVar5 < 1) goto LAB_001495e2;
    psVar19 = (secp256k1_modinv64_signed62 *)0x1;
    psVar28 = (secp256k1_gej *)(ulong)uVar6;
    pcStack_210 = (code *)0x149394;
    a_01 = psVar23;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar23,uVar6,
                       (secp256k1_modinv64_signed62 *)psVar33,1);
    if (-1 < iVar5) goto LAB_001495e7;
    pcStack_210 = (code *)0x1493b1;
    secp256k1_modinv64_update_fg_62_var
              (uVar6,(secp256k1_modinv64_signed62 *)psVar32,(secp256k1_modinv64_signed62 *)psVar23,
               &sStack_188);
    if (auStack_1e8._48_8_ == 0) {
      if (1 < (int)uVar6) {
        uVar37 = 1;
        uVar10 = 0;
        do {
          uVar10 = uVar10 | auStack_1b0[uVar37 - 1];
          uVar37 = uVar37 + 1;
        } while (uVar6 != uVar37);
        if (uVar10 != 0) goto LAB_001493e1;
      }
      a_01 = (secp256k1_gej *)(auStack_1e8 + 0x30);
      psVar28 = (secp256k1_gej *)(ulong)uVar6;
      psVar19 = (secp256k1_modinv64_signed62 *)0x0;
      pcStack_210 = (code *)0x1494c7;
      iVar5 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,uVar6,&SECP256K1_SIGNED62_ONE,0);
      if (iVar5 != 0) goto LAB_00149605;
      pcStack_210 = (code *)0x1494e9;
      iVar5 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)auStack_1e8,uVar6,&SECP256K1_SIGNED62_ONE,-1
                        );
      psVar32 = apsStack_1f8[0];
      if (iVar5 != 0) {
        pcStack_210 = (code *)0x14950a;
        iVar5 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_1e8,uVar6,&SECP256K1_SIGNED62_ONE,
                           1);
        if (iVar5 != 0) {
          psVar28 = (secp256k1_gej *)0x5;
          psVar19 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_210 = (code *)0x149524;
          a_01 = psVar32;
          iVar5 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar32,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar5 != 0) goto LAB_0014960a;
          a_01 = (secp256k1_gej *)auStack_168;
          psVar28 = (secp256k1_gej *)0x5;
          psVar19 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_210 = (code *)0x149547;
          iVar5 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar5 != 0) goto LAB_0014960a;
          a_01 = (secp256k1_gej *)auStack_1e8;
          psVar19 = (secp256k1_modinv64_signed62 *)0x1;
          psVar28 = (secp256k1_gej *)(ulong)uVar6;
          pcStack_210 = (code *)0x149563;
          iVar5 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_01,uVar6,
                             (secp256k1_modinv64_signed62 *)psVar33,1);
          if (iVar5 != 0) goto LAB_0014960a;
        }
      }
      pcStack_210 = (code *)0x149586;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)auStack_168,
                 (int64_t)apsStack_1f8[(long)(int)uVar6 + 1],(secp256k1_modinv64_modinfo *)psVar33);
      (psVar32->x).n[4] = auStack_168._32_8_;
      (psVar32->x).n[2] = auStack_168._16_8_;
      (psVar32->x).n[3] = auStack_168._24_8_;
      (psVar32->x).n[0] = auStack_168._0_8_;
      (psVar32->x).n[1] = auStack_168._8_8_;
      return;
    }
LAB_001493e1:
    lVar21 = (long)(int)uVar6;
    psVar36 = apsStack_1f8[lVar21 + 1];
    psVar19 = (secp256k1_modinv64_signed62 *)auStack_1b0[lVar21 + -2];
    a_01 = (secp256k1_gej *)((long)psVar36 >> 0x3f ^ (ulong)psVar36 | lVar21 + -2 >> 0x3f);
    psVar28 = (secp256k1_gej *)((long)psVar19 >> 0x3f ^ (ulong)psVar19 | (ulong)a_01);
    if (psVar28 == (secp256k1_gej *)0x0) {
      psVar26 = (secp256k1_gej *)(ulong)(uVar6 - 1);
      apsStack_1f8[lVar21] = (secp256k1_gej *)((ulong)apsStack_1f8[lVar21] | (long)psVar36 << 0x3e);
      psVar19 = (secp256k1_modinv64_signed62 *)((long)psVar19 << 0x3e);
      auStack_1b0[lVar21 + -3] = auStack_1b0[lVar21 + -3] | (ulong)psVar19;
    }
    if ((int)uStack_200 == 0xb) goto LAB_001495ec;
    uVar6 = (uint)psVar26;
    psVar19 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_210 = (code *)0x149445;
    psVar28 = psVar26;
    a_01 = psVar32;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar32,uVar6,
                       (secp256k1_modinv64_signed62 *)psVar33,-1);
    if (iVar5 < 1) goto LAB_001495f1;
    psVar19 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_210 = (code *)0x14945f;
    psVar28 = psVar26;
    a_01 = psVar32;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar32,uVar6,
                       (secp256k1_modinv64_signed62 *)psVar33,1);
    if (0 < iVar5) goto LAB_001495f6;
    psVar19 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_210 = (code *)0x14947b;
    psVar28 = psVar26;
    a_01 = psVar23;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar23,uVar6,
                       (secp256k1_modinv64_signed62 *)psVar33,-1);
    if (iVar5 < 1) goto LAB_001495fb;
    psVar19 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_210 = (code *)0x149495;
    psVar28 = psVar26;
    a_01 = psVar23;
    iVar5 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar23,uVar6,
                       (secp256k1_modinv64_signed62 *)psVar33,1);
    if (-1 < iVar5) goto LAB_00149600;
    uStack_200 = (ulong)((int)uStack_200 + 1);
    psVar36 = psVar33;
    uStack_204 = uVar6;
    goto LAB_00149138;
  }
LAB_001495d8:
  pcStack_210 = (code *)0x1495dd;
  secp256k1_modinv64_var_cold_20();
LAB_001495dd:
  pcStack_210 = (code *)0x1495e2;
  secp256k1_modinv64_var_cold_19();
LAB_001495e2:
  pcStack_210 = (code *)0x1495e7;
  secp256k1_modinv64_var_cold_18();
LAB_001495e7:
  pcStack_210 = (code *)0x1495ec;
  secp256k1_modinv64_var_cold_17();
LAB_001495ec:
  pcStack_210 = (code *)0x1495f1;
  secp256k1_modinv64_var_cold_14();
LAB_001495f1:
  pcStack_210 = (code *)0x1495f6;
  secp256k1_modinv64_var_cold_13();
LAB_001495f6:
  pcStack_210 = (code *)0x1495fb;
  secp256k1_modinv64_var_cold_12();
LAB_001495fb:
  pcStack_210 = (code *)0x149600;
  secp256k1_modinv64_var_cold_11();
LAB_00149600:
  pcStack_210 = (code *)0x149605;
  secp256k1_modinv64_var_cold_10();
LAB_00149605:
  pcStack_210 = (code *)0x14960a;
  secp256k1_modinv64_var_cold_15();
LAB_0014960a:
  pcStack_210 = (code *)0x14960f;
  secp256k1_modinv64_var_cold_16();
  psVar36 = psVar33;
LAB_0014960f:
  pcStack_210 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_9();
  uVar37 = (psVar28->x).n[0];
  if (uVar37 >> 0x3e == 0) {
    uVar10 = (psVar28->x).n[1];
    if (0x3fffffffffffffff < uVar10) goto LAB_0014969e;
    psVar19 = (secp256k1_modinv64_signed62 *)(psVar28->x).n[2];
    if ((secp256k1_modinv64_signed62 *)0x3fffffffffffffff < psVar19) goto LAB_001496a3;
    uVar11 = (psVar28->x).n[3];
    if (0x3fffffffffffffff < uVar11) goto LAB_001496a8;
    psVar28 = (secp256k1_gej *)(psVar28->x).n[4];
    if (psVar28 < (secp256k1_gej *)0x100) {
      (a_01->x).n[0] = uVar10 << 0x3e | uVar37;
      (a_01->x).n[1] = (long)psVar19 << 0x3c | uVar10 >> 2;
      (a_01->x).n[2] = uVar11 << 0x3a | (ulong)psVar19 >> 4;
      (a_01->x).n[3] = (long)psVar28 << 0x38 | uVar11 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_01);
      return;
    }
  }
  else {
    psStack_218 = (secp256k1_gej *)0x14969e;
    secp256k1_scalar_from_signed62_cold_5();
LAB_0014969e:
    psStack_218 = (secp256k1_gej *)0x1496a3;
    secp256k1_scalar_from_signed62_cold_4();
LAB_001496a3:
    psStack_218 = (secp256k1_gej *)0x1496a8;
    secp256k1_scalar_from_signed62_cold_3();
LAB_001496a8:
    psStack_218 = (secp256k1_gej *)0x1496ad;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_218 = (secp256k1_gej *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_218 = psVar27;
  lStack_220 = lVar41;
  psStack_228 = psVar32;
  psStack_230 = psVar23;
  psStack_238 = psVar36;
  psStack_240 = psVar26;
  uVar1 = (a_01->x).n[0];
  uStack_260 = (a_01->x).n[1];
  uStack_268 = (a_01->x).n[2];
  uStack_270 = (a_01->x).n[3];
  uStack_280 = (a_01->x).n[4];
  uVar2 = (psVar28->x).n[0];
  psStack_248 = (secp256k1_gej *)(psVar28->x).n[1];
  uVar3 = (psVar28->x).n[2];
  uStack_2a8 = *extraout_RDX;
  psStack_2a0 = (secp256k1_gej *)extraout_RDX[1];
  uStack_2b8 = extraout_RDX[2];
  psStack_2b0 = (secp256k1_gej *)extraout_RDX[3];
  uStack_250 = (psVar28->x).n[3];
  uStack_288 = (psVar28->x).n[4];
  uVar37 = 5;
  psVar36 = (secp256k1_gej *)0xfffffffffffffffe;
  psStack_2c0 = (secp256k1_modinv64_signed62 *)0x149748;
  psVar26 = a_01;
  iVar5 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar19,-2);
  psVar27 = psVar28;
  if (iVar5 < 1) {
LAB_0014a1ed:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a1f2;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_0014a1f2:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a1f7;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_0014a1f7:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a1fc;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_0014a1fc:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a201;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_0014a201:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a206;
    secp256k1_modinv64_update_de_62_cold_30();
    psVar42 = psVar19;
LAB_0014a206:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a20b;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_0014a20b:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a210;
    secp256k1_modinv64_update_de_62_cold_1();
    psVar19 = psVar42;
LAB_0014a210:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a215;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_0014a215:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a21a;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0014a21a:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a21f;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_0014a21f:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a224;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_0014a224:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a229;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_0014a229:
    psVar23 = psVar26;
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a22e;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_0014a22e:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a233;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0014a233:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a238;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0014a238:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a23d;
    secp256k1_modinv64_update_de_62_cold_9();
    psVar26 = psVar23;
LAB_0014a23d:
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a242;
    secp256k1_modinv64_update_de_62_cold_28();
  }
  else {
    psVar36 = (secp256k1_gej *)0x1;
    uVar37 = 5;
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14976a;
    psVar26 = a_01;
    psStack_278 = a_01;
    iVar5 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar19,1);
    if (-1 < iVar5) goto LAB_0014a1f2;
    uVar37 = 5;
    psVar36 = (secp256k1_gej *)0xfffffffffffffffe;
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x149789;
    psVar26 = psVar28;
    iVar5 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)psVar28,5,psVar19,-2);
    if (iVar5 < 1) goto LAB_0014a1f7;
    psVar36 = (secp256k1_gej *)0x1;
    uVar37 = 5;
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x1497a6;
    psVar26 = psVar28;
    iVar5 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)psVar28,5,psVar19,1);
    if (-1 < iVar5) goto LAB_0014a1fc;
    psVar27 = (secp256k1_gej *)0x3fffffffffffffff;
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x1497cc;
    psStack_290 = psVar28;
    uStack_258 = uVar3;
    iVar8 = secp256k1_modinv64_abs(uStack_2a8);
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x1497d9;
    psVar26 = psStack_2a0;
    iVar9 = secp256k1_modinv64_abs((int64_t)psStack_2a0);
    psVar36 = (secp256k1_gej *)(0x4000000000000000 - iVar9);
    if ((long)psVar36 < iVar8) goto LAB_0014a201;
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x1497f4;
    iVar8 = secp256k1_modinv64_abs(uStack_2b8);
    psStack_2c0 = (secp256k1_modinv64_signed62 *)0x149801;
    psVar26 = psStack_2b0;
    iVar9 = secp256k1_modinv64_abs((int64_t)psStack_2b0);
    psVar36 = (secp256k1_gej *)(0x4000000000000000 - iVar9);
    psVar42 = psVar19;
    if ((long)psVar36 < iVar8) goto LAB_0014a206;
    uVar37 = uStack_2a8 * uVar1;
    psVar36 = SUB168(SEXT816((long)uStack_2a8) * SEXT816((long)uVar1),8);
    uVar10 = (long)psStack_2a0 * uVar2;
    psVar26 = SUB168(SEXT816((long)psStack_2a0) * SEXT816((long)uVar2),8);
    a_01 = (secp256k1_gej *)0x7fffffffffffffff;
    lVar41 = (0x7fffffffffffffff - (long)psVar26) - (long)psVar36;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar26,(long)psVar36) !=
        SBORROW8(lVar41,(ulong)(~uVar10 < uVar37))) !=
        (long)(lVar41 - (ulong)(~uVar10 < uVar37)) < 0 && -1 < (long)psVar26) goto LAB_0014a23d;
    psVar32 = (secp256k1_gej *)(uVar10 + uVar37);
    psVar26 = (secp256k1_gej *)
              ((long)(psVar36->x).n + (long)(psVar26->x).n + (ulong)CARRY8(uVar10,uVar37));
    uVar11 = uStack_2b8 * uVar1;
    lVar21 = SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)uVar1),8);
    uVar12 = (long)psStack_2b0 * uVar2;
    lVar22 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)uVar2),8);
    uVar10 = (ulong)(-uVar12 - 1 < uVar11);
    lVar41 = (0x7fffffffffffffff - lVar22) - lVar21;
    bVar43 = (SBORROW8(0x7fffffffffffffff - lVar22,lVar21) != SBORROW8(lVar41,uVar10)) !=
             (long)(lVar41 - uVar10) < 0;
    psVar36 = (secp256k1_gej *)CONCAT71((int7)(-uVar12 - 1 >> 8),bVar43 && -1 < lVar22);
    if (!bVar43 || -1 >= lVar22) {
      psVar42 = (secp256k1_modinv64_signed62 *)((long)uStack_280 >> 0x3f);
      psVar36 = (secp256k1_gej *)((long)uStack_288 >> 0x3f);
      lVar29 = ((ulong)psStack_2a0 & (ulong)psVar36) + (uStack_2a8 & (ulong)psVar42);
      psVar28 = (secp256k1_gej *)(uVar12 + uVar11);
      lVar21 = lVar22 + lVar21 + (ulong)CARRY8(uVar12,uVar11);
      lVar41 = psVar19->v[0];
      uVar10 = psVar19[1].v[0];
      uVar37 = lVar29 - (uVar10 * (long)psVar32 + lVar29 & 0x3fffffffffffffff);
      puVar13 = (uint64_t *)(uVar37 * lVar41);
      psVar23 = SUB168(SEXT816((long)uVar37) * SEXT816(lVar41),8);
      psStack_298 = psVar19;
      if (-1 < (long)psVar23) {
        uVar11 = (ulong)((secp256k1_gej *)(-(long)puVar13 - 1U) < psVar32);
        lVar22 = (0x7fffffffffffffff - (long)psVar23) - (long)psVar26;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar23,(long)psVar26) != SBORROW8(lVar22,uVar11))
            == (long)(lVar22 - uVar11) < 0) goto LAB_0014992f;
LAB_00149af0:
        psStack_2c0 = (secp256k1_modinv64_signed62 *)0x149af5;
        secp256k1_modinv64_update_de_62_cold_26();
LAB_00149af5:
        lVar29 = (-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0);
        lVar22 = lVar21 - lVar29;
        if ((SBORROW8(lVar21,lVar29) != SBORROW8(lVar22,(ulong)(psVar28 < (secp256k1_gej *)-uVar10))
            ) == (long)(lVar22 - (ulong)(psVar28 < (secp256k1_gej *)-uVar10)) < 0)
        goto LAB_0014997f;
LAB_00149b17:
        psStack_2c0 = (secp256k1_modinv64_signed62 *)0x149b1c;
        secp256k1_modinv64_update_de_62_cold_25();
        uVar11 = extraout_RAX;
        lVar21 = extraout_RDX_00;
LAB_00149b1c:
        psVar33 = (secp256k1_gej *)((-0x8000000000000000 - lVar21) - (ulong)(uVar11 != 0));
        psVar26 = (secp256k1_gej *)
                  (((long)psVar32 - (long)psVar33) - (ulong)(psVar28 < (secp256k1_gej *)-uVar11));
        if ((SBORROW8((long)psVar32,(long)psVar33) !=
            SBORROW8((long)psVar32 - (long)psVar33,(ulong)(psVar28 < (secp256k1_gej *)-uVar11))) ==
            (long)psVar26 < 0) {
LAB_00149a02:
          uVar10 = uVar10 >> 0x3e | lVar41 << 2;
          bVar43 = CARRY8((ulong)psVar28,uVar11);
          psVar28 = (secp256k1_gej *)((long)(psVar28->x).n + uVar11);
          psVar32 = (secp256k1_gej *)((long)(psVar32->x).n + (ulong)bVar43 + lVar21);
          psVar33 = (secp256k1_gej *)(uStack_2b8 * uStack_260 + uVar10);
          psVar26 = (secp256k1_gej *)
                    (SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)uStack_260),8) +
                     (lVar41 >> 0x3e) + (ulong)CARRY8(uStack_2b8 * uStack_260,uVar10));
          uVar10 = (long)psStack_2b0 * (long)psVar23;
          lVar41 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)psVar23),8);
          if (lVar41 < 0) goto LAB_00149b46;
          uVar11 = (ulong)((secp256k1_gej *)(-1 - uVar10) < psVar33);
          lVar21 = (0x7fffffffffffffff - lVar41) - (long)psVar26;
          psVar19 = (secp256k1_modinv64_signed62 *)(lVar21 - uVar11);
          if ((SBORROW8(0x7fffffffffffffff - lVar41,(long)psVar26) != SBORROW8(lVar21,uVar11)) !=
              (long)psVar19 < 0) goto LAB_00149b5e;
        }
        else {
LAB_00149b41:
          psStack_2c0 = (secp256k1_modinv64_signed62 *)0x149b46;
          secp256k1_modinv64_update_de_62_cold_24();
          uVar10 = extraout_RAX_00;
          lVar41 = extraout_RDX_01;
LAB_00149b46:
          psVar19 = (secp256k1_modinv64_signed62 *)
                    ((-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0));
          if ((SBORROW8((long)psVar26,(long)psVar19) !=
              SBORROW8((long)psVar26 - (long)psVar19,(ulong)(psVar33 < (secp256k1_gej *)-uVar10)))
              != (long)(((long)psVar26 - (long)psVar19) -
                       (ulong)(psVar33 < (secp256k1_gej *)-uVar10)) < 0) {
LAB_00149b5e:
            psStack_2c0 = (secp256k1_modinv64_signed62 *)0x149b63;
            secp256k1_modinv64_update_de_62_cold_23();
            goto LAB_00149b69;
          }
        }
        bVar43 = CARRY8((ulong)psVar33,uVar10);
        psVar33 = (secp256k1_gej *)((long)(psVar33->x).n + uVar10);
        psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (ulong)bVar43 + lVar41);
        psVar7 = (secp256k1_gej *)psStack_298->v[1];
        psVar19 = psStack_298;
        if (psVar7 == (secp256k1_gej *)0x0) goto LAB_00149b69;
        psVar31 = (secp256k1_gej *)((long)psVar7 * uVar37);
        psVar24 = SUB168(SEXT816((long)psVar7) * SEXT816((long)uVar37),8);
        if ((long)psVar24 < 0) goto LAB_0014a103;
        uVar10 = (ulong)((secp256k1_gej *)(-(long)psVar31 - 1U) < psVar28);
        lVar41 = (0x7fffffffffffffff - (long)psVar24) - (long)psVar32;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar24,(long)psVar32) != SBORROW8(lVar41,uVar10))
            != (long)(lVar41 - uVar10) < 0) goto LAB_0014a125;
LAB_00149a9c:
        bVar43 = CARRY8((ulong)psVar31,(ulong)psVar28);
        psVar31 = (secp256k1_gej *)((long)(psVar31->x).n + (long)(psVar28->x).n);
        psVar24 = (secp256k1_gej *)((long)(psVar32->x).n + (long)(psVar24->x).n + (ulong)bVar43);
        uVar10 = (long)psVar7 * (long)psVar36;
        lVar41 = SUB168(SEXT816((long)psVar7) * SEXT816((long)psVar36),8);
        if (lVar41 < 0) goto LAB_0014a12a;
        psVar32 = (secp256k1_gej *)(-1 - uVar10);
        lVar21 = ((long)a_01 - lVar41) - (long)psVar26;
        psVar28 = (secp256k1_gej *)(lVar21 - (ulong)(psVar32 < psVar33));
        if ((SBORROW8((long)a_01 - lVar41,(long)psVar26) !=
            SBORROW8(lVar21,(ulong)(psVar32 < psVar33))) != (long)psVar28 < 0) goto LAB_0014a14c;
LAB_00149acd:
        bVar43 = CARRY8((ulong)psVar33,uVar10);
        psVar33 = (secp256k1_gej *)((long)(psVar33->x).n + uVar10);
        psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (ulong)bVar43 + lVar41);
        psVar32 = psVar24;
        psVar28 = psVar31;
LAB_00149b69:
        psVar24 = psStack_278;
        uVar10 = (long)psVar32 << 2 | (ulong)psVar28 >> 0x3e;
        psVar23 = (secp256k1_gej *)(uStack_2a8 * uStack_268 + uVar10);
        psVar7 = (secp256k1_gej *)
                 (SUB168(SEXT816((long)uStack_2a8) * SEXT816((long)uStack_268),8) +
                  ((long)psVar32 >> 0x3e) + (ulong)CARRY8(uStack_2a8 * uStack_268,uVar10));
        (psStack_278->x).n[0] = (ulong)psVar28 & 0x3fffffffffffffff;
        uVar10 = (long)psStack_2a0 * uStack_258;
        lVar41 = SUB168(SEXT816((long)psStack_2a0) * SEXT816((long)uStack_258),8);
        (psStack_290->x).n[0] = (ulong)psVar33 & 0x3fffffffffffffff;
        if (lVar41 < 0) {
          psVar28 = (secp256k1_gej *)((-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0));
          psVar32 = (secp256k1_gej *)
                    (((long)psVar7 - (long)psVar28) - (ulong)(psVar23 < (secp256k1_gej *)-uVar10));
          if ((SBORROW8((long)psVar7,(long)psVar28) !=
              SBORROW8((long)psVar7 - (long)psVar28,(ulong)(psVar23 < (secp256k1_gej *)-uVar10))) !=
              (long)psVar32 < 0) goto LAB_00149cc7;
LAB_00149bd7:
          uVar11 = (ulong)psVar33 >> 0x3e | (long)psVar26 << 2;
          bVar43 = CARRY8((ulong)psVar23,uVar10);
          psVar23 = (secp256k1_gej *)((long)(psVar23->x).n + uVar10);
          psVar7 = (secp256k1_gej *)((long)(psVar7->x).n + (ulong)bVar43 + lVar41);
          psVar28 = (secp256k1_gej *)(uStack_2b8 * uStack_268 + uVar11);
          psVar32 = (secp256k1_gej *)
                    (SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)uStack_268),8) +
                     ((long)psVar26 >> 0x3e) + (ulong)CARRY8(uStack_2b8 * uStack_268,uVar11));
          uVar10 = (long)psStack_2b0 * uStack_258;
          lVar41 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)uStack_258),8);
          if (lVar41 < 0) goto LAB_00149ccc;
          uVar11 = (ulong)((secp256k1_gej *)(-1 - uVar10) < psVar28);
          lVar21 = ((long)a_01 - lVar41) - (long)psVar32;
          if ((SBORROW8((long)a_01 - lVar41,(long)psVar32) != SBORROW8(lVar21,uVar11)) !=
              (long)(lVar21 - uVar11) < 0) goto LAB_00149cee;
        }
        else {
          psVar32 = (secp256k1_gej *)(-1 - uVar10);
          lVar21 = ((long)a_01 - lVar41) - (long)psVar7;
          psVar28 = (secp256k1_gej *)(lVar21 - (ulong)(psVar32 < psVar23));
          if ((SBORROW8((long)a_01 - lVar41,(long)psVar7) !=
              SBORROW8(lVar21,(ulong)(psVar32 < psVar23))) == (long)psVar28 < 0) goto LAB_00149bd7;
LAB_00149cc7:
          psStack_2c0 = (secp256k1_modinv64_signed62 *)0x149ccc;
          secp256k1_modinv64_update_de_62_cold_22();
          uVar10 = extraout_RAX_01;
          lVar41 = extraout_RDX_02;
LAB_00149ccc:
          lVar22 = (-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0);
          lVar21 = (long)psVar32 - lVar22;
          if ((SBORROW8((long)psVar32,lVar22) !=
              SBORROW8(lVar21,(ulong)(psVar28 < (secp256k1_gej *)-uVar10))) !=
              (long)(lVar21 - (ulong)(psVar28 < (secp256k1_gej *)-uVar10)) < 0) {
LAB_00149cee:
            psStack_2c0 = (secp256k1_modinv64_signed62 *)0x149cf3;
            secp256k1_modinv64_update_de_62_cold_21();
            goto LAB_00149cf9;
          }
        }
        bVar43 = CARRY8((ulong)psVar28,uVar10);
        psVar28 = (secp256k1_gej *)((long)(psVar28->x).n + uVar10);
        psVar32 = (secp256k1_gej *)((long)(psVar32->x).n + (ulong)bVar43 + lVar41);
        psVar31 = (secp256k1_gej *)psVar19->v[2];
        if (psVar31 == (secp256k1_gej *)0x0) goto LAB_00149cf9;
        psVar26 = (secp256k1_gej *)((long)psVar31 * uVar37);
        psVar33 = SUB168(SEXT816((long)psVar31) * SEXT816((long)uVar37),8);
        if ((long)psVar33 < 0) goto LAB_0014a151;
        uVar10 = (ulong)((secp256k1_gej *)(-(long)psVar26 - 1U) < psVar23);
        lVar41 = ((long)a_01 - (long)psVar33) - (long)psVar7;
        psVar34 = psVar23;
        if ((SBORROW8((long)a_01 - (long)psVar33,(long)psVar7) != SBORROW8(lVar41,uVar10)) !=
            (long)(lVar41 - uVar10) < 0) goto LAB_0014a173;
LAB_00149c6c:
        bVar43 = CARRY8((ulong)psVar26,(ulong)psVar34);
        psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (long)(psVar34->x).n);
        psVar33 = (secp256k1_gej *)((long)(psVar7->x).n + (long)(psVar33->x).n + (ulong)bVar43);
        uVar10 = (long)psVar31 * (long)psVar36;
        lVar41 = SUB168(SEXT816((long)psVar31) * SEXT816((long)psVar36),8);
        if (lVar41 < 0) goto LAB_0014a178;
        psVar35 = (secp256k1_gej *)(-1 - uVar10);
        lVar21 = ((long)a_01 - lVar41) - (long)psVar32;
        psVar19 = (secp256k1_modinv64_signed62 *)(lVar21 - (ulong)(psVar35 < psVar28));
        psVar23 = psVar26;
        psVar7 = psVar33;
        if ((SBORROW8((long)a_01 - lVar41,(long)psVar32) !=
            SBORROW8(lVar21,(ulong)(psVar35 < psVar28))) != (long)psVar19 < 0) goto LAB_0014a19a;
LAB_00149c9d:
        bVar43 = CARRY8((ulong)psVar28,uVar10);
        psVar28 = (secp256k1_gej *)((long)(psVar28->x).n + uVar10);
        psVar32 = (secp256k1_gej *)((long)(psVar32->x).n + (ulong)bVar43 + lVar41);
LAB_00149cf9:
        uVar10 = (long)psVar7 << 2 | (ulong)psVar23 >> 0x3e;
        psVar34 = (secp256k1_gej *)(uStack_2a8 * uStack_270 + uVar10);
        psVar35 = (secp256k1_gej *)
                  (SUB168(SEXT816((long)uStack_2a8) * SEXT816((long)uStack_270),8) +
                   ((long)psVar7 >> 0x3e) + (ulong)CARRY8(uStack_2a8 * uStack_270,uVar10));
        (psVar24->x).n[1] = (ulong)psVar23 & 0x3fffffffffffffff;
        uVar10 = (long)psStack_2a0 * uStack_250;
        lVar41 = SUB168(SEXT816((long)psStack_2a0) * SEXT816((long)uStack_250),8);
        (psStack_290->x).n[1] = (ulong)psVar28 & 0x3fffffffffffffff;
        if (lVar41 < 0) {
          uVar11 = (-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0);
          psVar26 = (secp256k1_gej *)
                    (((long)psVar35 - uVar11) - (ulong)(psVar34 < (secp256k1_gej *)-uVar10));
          if ((SBORROW8((long)psVar35,uVar11) !=
              SBORROW8((long)psVar35 - uVar11,(ulong)(psVar34 < (secp256k1_gej *)-uVar10))) !=
              (long)psVar26 < 0) goto LAB_00149dcf;
LAB_00149d65:
          uVar12 = (ulong)psVar28 >> 0x3e | (long)psVar32 << 2;
          bVar43 = CARRY8((ulong)psVar34,uVar10);
          psVar34 = (secp256k1_gej *)((long)(psVar34->x).n + uVar10);
          psVar35 = (secp256k1_gej *)((long)(psVar35->x).n + (ulong)bVar43 + lVar41);
          uVar11 = uStack_2b8 * uStack_270 + uVar12;
          psVar26 = (secp256k1_gej *)
                    (SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)uStack_270),8) +
                     ((long)psVar32 >> 0x3e) + (ulong)CARRY8(uStack_2b8 * uStack_270,uVar12));
          uVar10 = (long)psStack_2b0 * uStack_250;
          lVar41 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)uStack_250),8);
          if (lVar41 < 0) goto LAB_00149dd4;
          uVar12 = (ulong)(-uVar10 - 1 < uVar11);
          lVar21 = ((long)a_01 - lVar41) - (long)psVar26;
          bVar43 = SBORROW8((long)a_01 - lVar41,(long)psVar26) != SBORROW8(lVar21,uVar12);
          lVar21 = lVar21 - uVar12;
        }
        else {
          psVar26 = (secp256k1_gej *)(-1 - uVar10);
          lVar21 = ((long)a_01 - lVar41) - (long)psVar35;
          uVar11 = lVar21 - (ulong)(psVar26 < psVar34);
          if ((SBORROW8((long)a_01 - lVar41,(long)psVar35) !=
              SBORROW8(lVar21,(ulong)(psVar26 < psVar34))) == (long)uVar11 < 0) goto LAB_00149d65;
LAB_00149dcf:
          psStack_2c0 = (secp256k1_modinv64_signed62 *)0x149dd4;
          secp256k1_modinv64_update_de_62_cold_20();
          uVar10 = extraout_RAX_02;
          lVar41 = extraout_RDX_03;
LAB_00149dd4:
          lVar22 = (-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0);
          lVar21 = (long)psVar26 - lVar22;
          bVar43 = SBORROW8((long)psVar26,lVar22) != SBORROW8(lVar21,(ulong)(uVar11 < -uVar10));
          lVar21 = lVar21 - (ulong)(uVar11 < -uVar10);
        }
        psVar19 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        if (bVar43 != lVar21 < 0) goto LAB_0014a215;
        psVar33 = (secp256k1_gej *)(uVar11 + uVar10);
        psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (ulong)CARRY8(uVar11,uVar10) + lVar41);
        psVar32 = (secp256k1_gej *)psStack_298->v[3];
        if (psVar32 == (secp256k1_gej *)0x0) goto LAB_00149e73;
        psVar31 = (secp256k1_gej *)((long)psVar32 * uVar37);
        psVar24 = SUB168(SEXT816((long)psVar32) * SEXT816((long)uVar37),8);
        if ((long)psVar24 < 0) goto LAB_0014a19f;
        uVar10 = (ulong)((secp256k1_gej *)(-(long)psVar31 - 1U) < psVar34);
        lVar41 = ((long)a_01 - (long)psVar24) - (long)psVar35;
        if ((SBORROW8((long)a_01 - (long)psVar24,(long)psVar35) != SBORROW8(lVar41,uVar10)) !=
            (long)(lVar41 - uVar10) < 0) goto LAB_0014a1c1;
LAB_00149e34:
        bVar43 = CARRY8((ulong)psVar31,(ulong)psVar34);
        psVar31 = (secp256k1_gej *)((long)(psVar31->x).n + (long)(psVar34->x).n);
        psVar24 = (secp256k1_gej *)((long)(psVar35->x).n + (long)(psVar24->x).n + (ulong)bVar43);
        uVar10 = (long)psVar32 * (long)psVar36;
        lVar41 = SUB168(SEXT816((long)psVar32) * SEXT816((long)psVar36),8);
        if (lVar41 < 0) goto LAB_0014a1c6;
        uVar11 = (ulong)((secp256k1_gej *)(-1 - uVar10) < psVar33);
        lVar21 = ((long)a_01 - lVar41) - (long)psVar26;
        psVar35 = psVar24;
        psVar34 = psVar31;
        if ((SBORROW8((long)a_01 - lVar41,(long)psVar26) != SBORROW8(lVar21,uVar11)) ==
            (long)(lVar21 - uVar11) < 0) {
          do {
            bVar43 = CARRY8((ulong)psVar33,uVar10);
            psVar33 = (secp256k1_gej *)((long)(psVar33->x).n + uVar10);
            psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (ulong)bVar43 + lVar41);
LAB_00149e73:
            psVar23 = psStack_278;
            uVar10 = (long)psVar35 << 2 | (ulong)psVar34 >> 0x3e;
            psVar34 = (secp256k1_gej *)((ulong)psVar34 & 0x3fffffffffffffff);
            psVar28 = (secp256k1_gej *)(uStack_2a8 * uStack_280 + uVar10);
            psVar32 = (secp256k1_gej *)
                      (SUB168(SEXT816((long)uStack_2a8) * SEXT816((long)uStack_280),8) +
                       ((long)psVar35 >> 0x3e) + (ulong)CARRY8(uStack_2a8 * uStack_280,uVar10));
            (psStack_278->x).n[2] = (uint64_t)psVar34;
            uVar10 = (long)psStack_2a0 * uStack_288;
            lVar41 = SUB168(SEXT816((long)psStack_2a0) * SEXT816((long)uStack_288),8);
            (psStack_290->x).n[2] = (ulong)psVar33 & 0x3fffffffffffffff;
            if (lVar41 < 0) {
              lVar22 = (-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0);
              lVar21 = (long)psVar32 - lVar22;
              psVar7 = (secp256k1_gej *)(lVar21 - (ulong)(psVar28 < (secp256k1_gej *)-uVar10));
              if ((SBORROW8((long)psVar32,lVar22) !=
                  SBORROW8(lVar21,(ulong)(psVar28 < (secp256k1_gej *)-uVar10))) != (long)psVar7 < 0)
              goto LAB_00149f4d;
LAB_00149ee1:
              uVar11 = (ulong)psVar33 >> 0x3e | (long)psVar26 << 2;
              bVar43 = CARRY8((ulong)psVar28,uVar10);
              psVar28 = (secp256k1_gej *)((long)(psVar28->x).n + uVar10);
              psVar32 = (secp256k1_gej *)((long)(psVar32->x).n + (ulong)bVar43 + lVar41);
              psVar34 = (secp256k1_gej *)(uStack_2b8 * uStack_280 + uVar11);
              psVar7 = (secp256k1_gej *)
                       (SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)uStack_280),8) +
                        ((long)psVar26 >> 0x3e) + (ulong)CARRY8(uStack_2b8 * uStack_280,uVar11));
              uVar10 = (long)psStack_2b0 * uStack_288;
              lVar41 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)uStack_288),8);
              if (lVar41 < 0) goto LAB_00149f52;
              psVar26 = (secp256k1_gej *)(-1 - uVar10);
              lVar21 = ((long)a_01 - lVar41) - (long)psVar7;
              bVar43 = SBORROW8((long)a_01 - lVar41,(long)psVar7) !=
                       SBORROW8(lVar21,(ulong)(psVar26 < psVar34));
              psVar33 = (secp256k1_gej *)(lVar21 - (ulong)(psVar26 < psVar34));
            }
            else {
              psVar7 = (secp256k1_gej *)(-1 - uVar10);
              lVar21 = ((long)a_01 - lVar41) - (long)psVar32;
              if ((SBORROW8((long)a_01 - lVar41,(long)psVar32) !=
                  SBORROW8(lVar21,(ulong)(psVar7 < psVar28))) ==
                  (long)(lVar21 - (ulong)(psVar7 < psVar28)) < 0) goto LAB_00149ee1;
LAB_00149f4d:
              psStack_2c0 = (secp256k1_modinv64_signed62 *)0x149f52;
              secp256k1_modinv64_update_de_62_cold_18();
              uVar10 = extraout_RAX_03;
              lVar41 = extraout_RDX_04;
LAB_00149f52:
              lVar22 = (-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0);
              lVar21 = (long)psVar7 - lVar22;
              bVar43 = SBORROW8((long)psVar7,lVar22) !=
                       SBORROW8(lVar21,(ulong)(psVar34 < (secp256k1_gej *)-uVar10));
              psVar26 = (secp256k1_gej *)(lVar21 - (ulong)(psVar34 < (secp256k1_gej *)-uVar10));
              psVar33 = psVar26;
            }
            psVar19 = psStack_298;
            psVar24 = (secp256k1_gej *)0x8000000000000000;
            if (bVar43 != (long)psVar33 < 0) goto LAB_0014a21a;
            psVar31 = (secp256k1_gej *)((long)(psVar34->x).n + uVar10);
            psVar7 = (secp256k1_gej *)
                     ((long)(psVar7->x).n + (ulong)CARRY8((ulong)psVar34,uVar10) + lVar41);
            psVar33 = (secp256k1_gej *)psStack_298->v[4];
            psVar26 = (secp256k1_gej *)((long)psVar33 * uVar37);
            uVar37 = SUB168(SEXT816((long)psVar33) * SEXT816((long)uVar37),8);
            if ((long)uVar37 < 0) {
              lVar21 = (-0x8000000000000000 - uVar37) - (ulong)(psVar26 != (secp256k1_gej *)0x0);
              lVar41 = (long)psVar32 - lVar21;
              if ((SBORROW8((long)psVar32,lVar21) !=
                  SBORROW8(lVar41,(ulong)(psVar28 < (secp256k1_gej *)-(long)psVar26))) !=
                  (long)(lVar41 - (ulong)(psVar28 < (secp256k1_gej *)-(long)psVar26)) < 0)
              goto LAB_0014a0de;
LAB_00149fad:
              bVar43 = CARRY8((ulong)psVar26,(ulong)psVar28);
              psVar26 = (secp256k1_gej *)((long)(psVar26->x).n + (long)(psVar28->x).n);
              uVar37 = (long)(psVar32->x).n + bVar43 + uVar37;
              uVar10 = (long)psVar33 * (long)psVar36;
              lVar41 = SUB168(SEXT816((long)psVar33) * SEXT816((long)psVar36),8);
              if (lVar41 < 0) goto LAB_0014a0e3;
              psVar36 = (secp256k1_gej *)(-uVar10 - 1);
              lVar21 = (long)a_01 - lVar41;
              lVar22 = lVar21 - (long)psVar7;
              a_01 = (secp256k1_gej *)(lVar22 - (ulong)(psVar36 < psVar31));
              if ((SBORROW8(lVar21,(long)psVar7) != SBORROW8(lVar22,(ulong)(psVar36 < psVar31))) ==
                  (long)a_01 < 0) goto LAB_00149fdb;
            }
            else {
              uVar10 = (ulong)((secp256k1_gej *)(-(long)psVar26 - 1U) < psVar28);
              lVar41 = ((long)a_01 - uVar37) - (long)psVar32;
              if ((SBORROW8((long)a_01 - uVar37,(long)psVar32) != SBORROW8(lVar41,uVar10)) ==
                  (long)(lVar41 - uVar10) < 0) goto LAB_00149fad;
LAB_0014a0de:
              psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a0e3;
              secp256k1_modinv64_update_de_62_cold_16();
              uVar10 = extraout_RAX_04;
              lVar41 = extraout_RDX_05;
LAB_0014a0e3:
              psVar32 = (secp256k1_gej *)((-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0));
              psVar36 = (secp256k1_gej *)
                        (((long)psVar7 - (long)psVar32) -
                        (ulong)(psVar31 < (secp256k1_gej *)-uVar10));
              if ((SBORROW8((long)psVar7,(long)psVar32) !=
                  SBORROW8((long)psVar7 - (long)psVar32,(ulong)(psVar31 < (secp256k1_gej *)-uVar10))
                  ) == (long)psVar36 < 0) {
LAB_00149fdb:
                a_01 = psStack_290;
                uVar11 = (long)(psVar31->x).n + uVar10;
                lVar41 = (long)(psVar7->x).n + (ulong)CARRY8(uVar10,(ulong)psVar31) + lVar41;
                psVar36 = (secp256k1_gej *)(uVar37 << 2 | (ulong)psVar26 >> 0x3e);
                (psVar23->x).n[3] = (ulong)psVar26 & 0x3fffffffffffffff;
                psVar27 = (secp256k1_gej *)(uVar11 & 0x3fffffffffffffff);
                (psStack_290->x).n[3] = (uint64_t)psVar27;
                psVar26 = (secp256k1_gej *)&psVar36[0xd79435e50d7942].z;
                uVar37 = ((long)uVar37 >> 0x3e) + -1 +
                         (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar36);
                if (uVar37 != 0xffffffffffffffff) goto LAB_0014a21f;
                uVar37 = 0xffffffffffffffff;
                uVar10 = uVar11 >> 0x3e | lVar41 * 4;
                (psVar23->x).n[4] = (uint64_t)psVar36;
                if ((lVar41 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar10) != -1)
                goto LAB_0014a224;
                (psStack_290->x).n[4] = uVar10;
                uVar37 = 5;
                psVar36 = (secp256k1_gej *)0xfffffffffffffffe;
                psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a053;
                psVar26 = psVar23;
                iVar5 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)psVar23,5,psVar19,-2);
                if (iVar5 < 1) goto LAB_0014a229;
                psVar36 = (secp256k1_gej *)0x1;
                uVar37 = 5;
                psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a070;
                iVar5 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)psVar23,5,psVar19,1);
                if (-1 < iVar5) goto LAB_0014a22e;
                uVar37 = 5;
                psVar36 = (secp256k1_gej *)0xfffffffffffffffe;
                psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a08f;
                psVar23 = a_01;
                iVar5 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,psVar19,-2);
                if (iVar5 < 1) goto LAB_0014a233;
                psVar36 = (secp256k1_gej *)0x1;
                uVar37 = 5;
                psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a0ac;
                psVar23 = a_01;
                iVar5 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,psVar19,1);
                if (iVar5 < 0) {
                  return;
                }
                goto LAB_0014a238;
              }
            }
            psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a103;
            secp256k1_modinv64_update_de_62_cold_15();
LAB_0014a103:
            lVar21 = (-0x8000000000000000 - (long)psVar24) -
                     (ulong)(psVar31 != (secp256k1_gej *)0x0);
            lVar41 = (long)psVar32 - lVar21;
            if ((SBORROW8((long)psVar32,lVar21) !=
                SBORROW8(lVar41,(ulong)(psVar28 < (secp256k1_gej *)-(long)psVar31))) ==
                (long)(lVar41 - (ulong)(psVar28 < (secp256k1_gej *)-(long)psVar31)) < 0)
            goto LAB_00149a9c;
LAB_0014a125:
            psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a12a;
            secp256k1_modinv64_update_de_62_cold_4();
            uVar10 = extraout_RAX_05;
            lVar41 = extraout_RDX_06;
LAB_0014a12a:
            psVar28 = (secp256k1_gej *)((-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0));
            psVar32 = (secp256k1_gej *)
                      (((long)psVar26 - (long)psVar28) - (ulong)(psVar33 < (secp256k1_gej *)-uVar10)
                      );
            if ((SBORROW8((long)psVar26,(long)psVar28) !=
                SBORROW8((long)psVar26 - (long)psVar28,(ulong)(psVar33 < (secp256k1_gej *)-uVar10)))
                == (long)psVar32 < 0) goto LAB_00149acd;
LAB_0014a14c:
            psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a151;
            secp256k1_modinv64_update_de_62_cold_3();
LAB_0014a151:
            lVar21 = (-0x8000000000000000 - (long)psVar33) -
                     (ulong)(psVar26 != (secp256k1_gej *)0x0);
            lVar41 = (long)psVar7 - lVar21;
            psVar34 = psVar23;
            if ((SBORROW8((long)psVar7,lVar21) !=
                SBORROW8(lVar41,(ulong)(psVar23 < (secp256k1_gej *)-(long)psVar26))) ==
                (long)(lVar41 - (ulong)(psVar23 < (secp256k1_gej *)-(long)psVar26)) < 0)
            goto LAB_00149c6c;
LAB_0014a173:
            psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a178;
            secp256k1_modinv64_update_de_62_cold_6();
            uVar10 = extraout_RAX_06;
            lVar41 = extraout_RDX_07;
            psVar34 = psVar23;
LAB_0014a178:
            psVar19 = (secp256k1_modinv64_signed62 *)
                      ((-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0));
            psVar35 = (secp256k1_gej *)
                      (((long)psVar32 - (long)psVar19) - (ulong)(psVar28 < (secp256k1_gej *)-uVar10)
                      );
            psVar23 = psVar26;
            psVar7 = psVar33;
            if ((SBORROW8((long)psVar32,(long)psVar19) !=
                SBORROW8((long)psVar32 - (long)psVar19,(ulong)(psVar28 < (secp256k1_gej *)-uVar10)))
                == (long)psVar35 < 0) goto LAB_00149c9d;
LAB_0014a19a:
            psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a19f;
            secp256k1_modinv64_update_de_62_cold_5();
LAB_0014a19f:
            lVar21 = (-0x8000000000000000 - (long)psVar24) -
                     (ulong)(psVar31 != (secp256k1_gej *)0x0);
            lVar41 = (long)psVar35 - lVar21;
            if ((SBORROW8((long)psVar35,lVar21) !=
                SBORROW8(lVar41,(ulong)(psVar34 < (secp256k1_gej *)-(long)psVar31))) ==
                (long)(lVar41 - (ulong)(psVar34 < (secp256k1_gej *)-(long)psVar31)) < 0)
            goto LAB_00149e34;
LAB_0014a1c1:
            psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a1c6;
            secp256k1_modinv64_update_de_62_cold_8();
            uVar10 = extraout_RAX_07;
            lVar41 = extraout_RDX_08;
LAB_0014a1c6:
            lVar22 = (-0x8000000000000000 - lVar41) - (ulong)(uVar10 != 0);
            lVar21 = (long)psVar26 - lVar22;
            psVar35 = psVar24;
            psVar34 = psVar31;
            if ((SBORROW8((long)psVar26,lVar22) !=
                SBORROW8(lVar21,(ulong)(psVar33 < (secp256k1_gej *)-uVar10))) !=
                (long)(lVar21 - (ulong)(psVar33 < (secp256k1_gej *)-uVar10)) < 0) break;
          } while( true );
        }
        psStack_2c0 = (secp256k1_modinv64_signed62 *)0x14a1ed;
        secp256k1_modinv64_update_de_62_cold_7();
        goto LAB_0014a1ed;
      }
      lVar29 = (-0x8000000000000000 - (long)psVar23) - (ulong)(puVar13 != (uint64_t *)0x0);
      lVar22 = (long)psVar26 - lVar29;
      if ((SBORROW8((long)psVar26,lVar29) !=
          SBORROW8(lVar22,(ulong)(psVar32 < (secp256k1_gej *)-(long)puVar13))) !=
          (long)(lVar22 - (ulong)(psVar32 < (secp256k1_gej *)-(long)puVar13)) < 0)
      goto LAB_00149af0;
LAB_0014992f:
      psVar42 = (secp256k1_modinv64_signed62 *)((ulong)psVar42 & uStack_2b8);
      psVar36 = (secp256k1_gej *)
                ((long)psVar42 +
                (((ulong)psVar36 & (ulong)psStack_2b0) -
                ((long)psVar42->v + uVar10 * (long)psVar28 + ((ulong)psVar36 & (ulong)psStack_2b0) &
                0x3fffffffffffffff)));
      bVar43 = CARRY8((ulong)puVar13,(ulong)psVar32);
      puVar13 = (uint64_t *)((long)(psVar32->x).n + (long)puVar13);
      psVar23 = (secp256k1_gej *)((long)(psVar26->x).n + (long)(psVar23->x).n + (ulong)bVar43);
      uVar10 = (long)psVar36 * lVar41;
      lVar41 = SUB168(SEXT816((long)psVar36) * SEXT816(lVar41),8);
      if (lVar41 < 0) goto LAB_00149af5;
      uVar11 = (ulong)((secp256k1_gej *)(-uVar10 - 1) < psVar28);
      lVar22 = (0x7fffffffffffffff - lVar41) - lVar21;
      if ((SBORROW8(0x7fffffffffffffff - lVar41,lVar21) != SBORROW8(lVar22,uVar11)) !=
          (long)(lVar22 - uVar11) < 0) goto LAB_00149b17;
LAB_0014997f:
      bVar43 = CARRY8(uVar10,(ulong)psVar28);
      uVar10 = (long)(psVar28->x).n + uVar10;
      lVar41 = lVar41 + lVar21 + (ulong)bVar43;
      if (((ulong)puVar13 & 0x3fffffffffffffff) != 0) goto LAB_0014a20b;
      psVar19 = psVar42;
      if ((uVar10 & 0x3fffffffffffffff) == 0) {
        uVar11 = (ulong)puVar13 >> 0x3e | (long)psVar23 << 2;
        psVar28 = (secp256k1_gej *)(uStack_2a8 * uStack_260 + uVar11);
        psVar32 = (secp256k1_gej *)
                  (SUB168(SEXT816((long)uStack_2a8) * SEXT816((long)uStack_260),8) +
                   ((long)psVar23 >> 0x3e) + (ulong)CARRY8(uStack_2a8 * uStack_260,uVar11));
        uVar11 = (long)psStack_2a0 * (long)psStack_248;
        lVar21 = SUB168(SEXT816((long)psStack_2a0) * SEXT816((long)psStack_248),8);
        psVar23 = psStack_248;
        if (lVar21 < 0) goto LAB_00149b1c;
        psVar26 = (secp256k1_gej *)(-1 - uVar11);
        lVar22 = (0x7fffffffffffffff - lVar21) - (long)psVar32;
        psVar33 = (secp256k1_gej *)(lVar22 - (ulong)(psVar26 < psVar28));
        if ((SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar32) !=
            SBORROW8(lVar22,(ulong)(psVar26 < psVar28))) != (long)psVar33 < 0) goto LAB_00149b41;
        goto LAB_00149a02;
      }
      goto LAB_0014a210;
    }
  }
  iVar5 = (int)uVar37;
  psStack_2c0 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_27();
  psVar42 = &sStack_320;
  psStack_2d0 = psVar27;
  psStack_2c8 = a_01;
  psStack_2c0 = psVar19;
  secp256k1_modinv64_mul_62(&sStack_2f8,(secp256k1_modinv64_signed62 *)psVar26,iVar5,1);
  psVar19 = a;
  secp256k1_modinv64_mul_62(&sStack_320,a,5,(int64_t)psVar36);
  lVar41 = 0;
  while ((ulong)sStack_2f8.v[lVar41] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_320.v[lVar41]) goto LAB_0014a2d7;
    lVar41 = lVar41 + 1;
    if (lVar41 == 4) {
      uVar6 = 4;
      while( true ) {
        if (sStack_2f8.v[uVar6] < sStack_320.v[uVar6]) {
          return;
        }
        if (sStack_320.v[uVar6] < sStack_2f8.v[uVar6]) break;
        bVar43 = uVar6 == 0;
        uVar6 = uVar6 - 1;
        if (bVar43) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0014a2d7:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar5 = (int)psVar42;
  if (iVar5 < 1) {
LAB_0014a584:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0014a589:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_0014a58e:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0014a593:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0014a598:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_0014a59d:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar1 = (psVar36->x).n[0];
    uVar2 = (psVar36->x).n[1];
    lVar41 = psVar19->v[0];
    lVar21 = *extraout_RDX_09;
    uVar37 = lVar41 * uVar1;
    lVar29 = SUB168(SEXT816(lVar41) * SEXT816((long)uVar1),8);
    uVar10 = lVar21 * uVar2;
    lVar25 = SUB168(SEXT816(lVar21) * SEXT816((long)uVar2),8);
    lVar22 = (0x7fffffffffffffff - lVar25) - lVar29;
    if ((SBORROW8(0x7fffffffffffffff - lVar25,lVar29) != SBORROW8(lVar22,(ulong)(~uVar10 < uVar37)))
        != (long)(lVar22 - (ulong)(~uVar10 < uVar37)) < 0 && -1 < lVar25) goto LAB_0014a59d;
    uVar3 = (psVar36->x).n[2];
    uVar4 = (psVar36->x).n[3];
    lVar29 = lVar25 + lVar29 + (ulong)CARRY8(uVar10,uVar37);
    uVar12 = lVar41 * uVar3;
    lVar22 = SUB168(SEXT816(lVar41) * SEXT816((long)uVar3),8);
    uVar40 = lVar21 * uVar4;
    lVar21 = SUB168(SEXT816(lVar21) * SEXT816((long)uVar4),8);
    uVar11 = (ulong)(-uVar40 - 1 < uVar12);
    lVar41 = (0x7fffffffffffffff - lVar21) - lVar22;
    if ((SBORROW8(0x7fffffffffffffff - lVar21,lVar22) != SBORROW8(lVar41,uVar11)) ==
        (long)(lVar41 - uVar11) < 0 || lVar21 < 0) {
      lVar41 = lVar21 + lVar22 + (ulong)CARRY8(uVar40,uVar12);
      if ((uVar10 + uVar37 & 0x3fffffffffffffff) != 0) goto LAB_0014a589;
      if ((uVar40 + uVar12 & 0x3fffffffffffffff) != 0) goto LAB_0014a58e;
      uVar11 = uVar40 + uVar12 >> 0x3e | lVar41 * 4;
      uVar37 = uVar10 + uVar37 >> 0x3e | lVar29 * 4;
      lVar41 = lVar41 >> 0x3e;
      lVar29 = lVar29 >> 0x3e;
      if (iVar5 != 1) {
        psVar42 = (secp256k1_modinv64_signed62 *)((ulong)psVar42 & 0xffffffff);
        psVar20 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar21 = psVar19->v[(long)psVar20];
          uVar12 = lVar21 * uVar1 + uVar37;
          lVar25 = SUB168(SEXT816(lVar21) * SEXT816((long)uVar1),8) + lVar29 +
                   (ulong)CARRY8(lVar21 * uVar1,uVar37);
          lVar22 = extraout_RDX_09[(long)psVar20];
          uVar10 = lVar22 * uVar2;
          lVar29 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar2),8);
          if (lVar29 < 0) {
            lVar38 = (-0x8000000000000000 - lVar29) - (ulong)(uVar10 != 0);
            lVar14 = lVar25 - lVar38;
            if ((SBORROW8(lVar25,lVar38) != SBORROW8(lVar14,(ulong)(uVar12 < -uVar10))) ==
                (long)(lVar14 - (ulong)(uVar12 < -uVar10)) < 0) goto LAB_0014a473;
LAB_0014a57a:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0014a57f:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0014a584;
          }
          uVar37 = (ulong)(-uVar10 - 1 < uVar12);
          lVar14 = (0x7fffffffffffffff - lVar29) - lVar25;
          if ((SBORROW8(0x7fffffffffffffff - lVar29,lVar25) != SBORROW8(lVar14,uVar37)) !=
              (long)(lVar14 - uVar37) < 0) goto LAB_0014a57a;
LAB_0014a473:
          lVar29 = lVar25 + lVar29 + (ulong)CARRY8(uVar12,uVar10);
          uVar39 = lVar21 * uVar3 + uVar11;
          lVar21 = SUB168(SEXT816(lVar21) * SEXT816((long)uVar3),8) + lVar41 +
                   (ulong)CARRY8(lVar21 * uVar3,uVar11);
          uVar40 = lVar22 * uVar4;
          lVar41 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar4),8);
          if (lVar41 < 0) {
            lVar25 = (-0x8000000000000000 - lVar41) - (ulong)(uVar40 != 0);
            lVar22 = lVar21 - lVar25;
            if ((SBORROW8(lVar21,lVar25) != SBORROW8(lVar22,(ulong)(uVar39 < -uVar40))) !=
                (long)(lVar22 - (ulong)(uVar39 < -uVar40)) < 0) goto LAB_0014a57f;
          }
          else {
            uVar37 = (ulong)(-uVar40 - 1 < uVar39);
            lVar22 = (0x7fffffffffffffff - lVar41) - lVar21;
            if ((SBORROW8(0x7fffffffffffffff - lVar41,lVar21) != SBORROW8(lVar22,uVar37)) !=
                (long)(lVar22 - uVar37) < 0) goto LAB_0014a57f;
          }
          lVar41 = lVar21 + lVar41 + (ulong)CARRY8(uVar39,uVar40);
          uVar37 = lVar29 * 4 | uVar12 + uVar10 >> 0x3e;
          psVar19->v[(long)((long)psVar20[-1].v + 0x27)] = uVar12 + uVar10 & 0x3fffffffffffffff;
          uVar11 = lVar41 * 4 | uVar39 + uVar40 >> 0x3e;
          extraout_RDX_09[(long)((long)psVar20[-1].v + 0x27)] = uVar39 + uVar40 & 0x3fffffffffffffff
          ;
          psVar20 = (secp256k1_modinv64_signed62 *)((long)psVar20->v + 1);
          lVar41 = lVar41 >> 0x3e;
          lVar29 = lVar29 >> 0x3e;
        } while (psVar42 != psVar20);
      }
      if (lVar29 + -1 + (ulong)(0x7fffffffffffffff < uVar37) != -1) goto LAB_0014a593;
      psVar19->v[(long)iVar5 + -1] = uVar37;
      if (lVar41 + -1 + (ulong)(0x7fffffffffffffff < uVar11) == -1) {
        extraout_RDX_09[(long)iVar5 + -1] = uVar11;
        return;
      }
      goto LAB_0014a598;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar41 = psVar42->v[0];
  lVar21 = psVar42->v[1];
  lVar22 = psVar42->v[2];
  lVar29 = psVar42->v[3];
  lVar25 = psVar42->v[4];
  lVar14 = 0;
  do {
    if (psVar42->v[lVar14] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014a7d3:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0014a7d8;
    }
    if (0x3fffffffffffffff < psVar42->v[lVar14]) goto LAB_0014a7d3;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  iVar5 = secp256k1_modinv64_mul_cmp_62(psVar42,5,b,-2);
  if (iVar5 < 1) {
LAB_0014a7d8:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0014a7dd:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014a7e2:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar5 = secp256k1_modinv64_mul_cmp_62(psVar42,5,b,1);
    if (-1 < iVar5) goto LAB_0014a7dd;
    uVar37 = lVar25 >> 0x3f;
    uVar12 = (long)psVar19 >> 0x3f;
    uVar10 = ((uVar37 & b->v[0]) + lVar41 ^ uVar12) - uVar12;
    uVar40 = ((long)uVar10 >> 0x3e) + (((uVar37 & b->v[1]) + lVar21 ^ uVar12) - uVar12);
    uVar39 = ((long)uVar40 >> 0x3e) + ((lVar22 + (uVar37 & b->v[2]) ^ uVar12) - uVar12);
    uVar11 = ((long)uVar39 >> 0x3e) + (((uVar37 & b->v[3]) + lVar29 ^ uVar12) - uVar12);
    lVar41 = ((long)uVar11 >> 0x3e) + (((uVar37 & b->v[4]) + lVar25 ^ uVar12) - uVar12);
    uVar12 = lVar41 >> 0x3f;
    uVar37 = (b->v[0] & uVar12) + (uVar10 & 0x3fffffffffffffff);
    uVar40 = ((long)uVar37 >> 0x3e) + (b->v[1] & uVar12) + (uVar40 & 0x3fffffffffffffff);
    uVar10 = ((long)uVar40 >> 0x3e) + (b->v[2] & uVar12) + (uVar39 & 0x3fffffffffffffff);
    uVar11 = ((long)uVar10 >> 0x3e) + (b->v[3] & uVar12) + (uVar11 & 0x3fffffffffffffff);
    uVar12 = (b->v[4] & uVar12) + lVar41 + ((long)uVar11 >> 0x3e);
    psVar42->v[0] = uVar37 & 0x3fffffffffffffff;
    psVar42->v[1] = uVar40 & 0x3fffffffffffffff;
    psVar42->v[2] = uVar10 & 0x3fffffffffffffff;
    psVar42->v[3] = uVar11 & 0x3fffffffffffffff;
    psVar42->v[4] = uVar12;
    if (0x3fffffffffffffff < uVar12) goto LAB_0014a7e2;
    iVar5 = secp256k1_modinv64_mul_cmp_62(psVar42,5,b,0);
    if (-1 < iVar5) {
      iVar5 = secp256k1_modinv64_mul_cmp_62(psVar42,5,b,1);
      if (iVar5 < 0) {
        return;
      }
      goto LAB_0014a7ec;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0014a7ec:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_scalar_inverse_var(secp256k1_scalar *r, const secp256k1_scalar *x) {
    secp256k1_modinv64_signed62 s;
#ifdef VERIFY
    int zero_in = secp256k1_scalar_is_zero(x);
#endif
    SECP256K1_SCALAR_VERIFY(x);

    secp256k1_scalar_to_signed62(&s, x);
    secp256k1_modinv64_var(&s, &secp256k1_const_modinfo_scalar);
    secp256k1_scalar_from_signed62(r, &s);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_scalar_is_zero(r) == zero_in);
}